

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall
glu::sl::ShaderParser::parseRequirement(ShaderParser *this,CaseRequirement *valueBlock)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  CaseRequirement local_160;
  CaseRequirement local_130;
  string local_100;
  int local_e0;
  deUint32 local_dc;
  int limitValue;
  deUint32 limitEnum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  deUint32 local_34;
  undefined1 local_30 [4];
  deUint32 affectedCasesFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  anyExtensionStringList;
  CaseRequirement *valueBlock_local;
  ShaderParser *this_local;
  
  anyExtensionStringList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)valueBlock;
  advanceToken(this);
  assumeToken(this,TOKEN_IDENTIFIER);
  bVar1 = std::operator==(&this->m_curTokenStr,"extension");
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
    local_34 = 0xffffffff;
    advanceToken(this);
    assumeToken(this,TOKEN_LEFT_BRACE);
    advanceToken(this);
    assumeToken(this,TOKEN_STRING);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    parseStringLiteral_abi_cxx11_(&local_68,this,pcVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    advanceToken(this);
    while (this->m_curToken != TOKEN_RIGHT_BRACE) {
      if (this->m_curToken == TOKEN_VERTICAL_BAR) {
        advanceToken(this);
        assumeToken(this,TOKEN_STRING);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        parseStringLiteral_abi_cxx11_(&local_88,this,pcVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_30,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        advanceToken(this);
      }
      else {
        std::operator+(&local_a8,"invalid extension list token: ",&this->m_curTokenStr);
        parseError(this,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    advanceToken(this,TOKEN_RIGHT_BRACE);
    if (this->m_curToken == TOKEN_IN) {
      advanceToken(this);
      local_34 = parseShaderStageList(this);
    }
    CaseRequirement::createAnyExtensionRequirement
              ((CaseRequirement *)&limitValue,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30,local_34);
    CaseRequirement::operator=
              ((CaseRequirement *)
               anyExtensionStringList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(CaseRequirement *)&limitValue);
    CaseRequirement::~CaseRequirement((CaseRequirement *)&limitValue);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_30);
  }
  else {
    bVar1 = std::operator==(&this->m_curTokenStr,"limit");
    if (bVar1) {
      advanceToken(this);
      assumeToken(this,TOKEN_STRING);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      parseStringLiteral_abi_cxx11_(&local_100,this,pcVar2);
      local_dc = getGLEnumFromName(this,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      advanceToken(this);
      assumeToken(this,TOKEN_GREATER);
      advanceToken(this);
      assumeToken(this,TOKEN_INT_LITERAL);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      local_e0 = parseIntLiteral(this,pcVar2);
      advanceToken(this);
      CaseRequirement::createLimitRequirement(&local_130,local_dc,local_e0);
      CaseRequirement::operator=
                ((CaseRequirement *)
                 anyExtensionStringList.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_130);
      CaseRequirement::~CaseRequirement(&local_130);
    }
    else {
      bVar1 = std::operator==(&this->m_curTokenStr,"full_glsl_es_100_support");
      if (bVar1) {
        advanceToken(this);
        CaseRequirement::createFullGLSLES100SpecificationRequirement();
        CaseRequirement::operator=
                  ((CaseRequirement *)
                   anyExtensionStringList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_160);
        CaseRequirement::~CaseRequirement(&local_160);
      }
      else {
        std::operator+(&local_180,"invalid requirement value: ",&this->m_curTokenStr);
        parseError(this,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
      }
    }
  }
  return;
}

Assistant:

void ShaderParser::parseRequirement (CaseRequirement& valueBlock)
{
	PARSE_DBG(("    parseRequirement()\n"));

	advanceToken();
	assumeToken(TOKEN_IDENTIFIER);

	if (m_curTokenStr == "extension")
	{
		std::vector<std::string>	anyExtensionStringList;
		deUint32					affectedCasesFlags		= -1; // by default all stages

		advanceToken();
		assumeToken(TOKEN_LEFT_BRACE);

		advanceToken();
		assumeToken(TOKEN_STRING);

		anyExtensionStringList.push_back(parseStringLiteral(m_curTokenStr.c_str()));
		advanceToken();

		for (;;)
		{
			if (m_curToken == TOKEN_RIGHT_BRACE)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				assumeToken(TOKEN_STRING);

				anyExtensionStringList.push_back(parseStringLiteral(m_curTokenStr.c_str()));
				advanceToken();
			}
			else
				parseError(string("invalid extension list token: " + m_curTokenStr));
		}
		advanceToken(TOKEN_RIGHT_BRACE);

		if (m_curToken == TOKEN_IN)
		{
			advanceToken();
			affectedCasesFlags = parseShaderStageList();
		}

		valueBlock = CaseRequirement::createAnyExtensionRequirement(anyExtensionStringList, affectedCasesFlags);
	}
	else if (m_curTokenStr == "limit")
	{
		deUint32	limitEnum;
		int			limitValue;

		advanceToken();

		assumeToken(TOKEN_STRING);
		limitEnum = getGLEnumFromName(parseStringLiteral(m_curTokenStr.c_str()));
		advanceToken();

		assumeToken(TOKEN_GREATER);
		advanceToken();

		assumeToken(TOKEN_INT_LITERAL);
		limitValue = parseIntLiteral(m_curTokenStr.c_str());
		advanceToken();

		valueBlock = CaseRequirement::createLimitRequirement(limitEnum, limitValue);
	}
	else if (m_curTokenStr == "full_glsl_es_100_support")
	{
		advanceToken();

		valueBlock = CaseRequirement::createFullGLSLES100SpecificationRequirement();
	}
	else
		parseError(string("invalid requirement value: " + m_curTokenStr));
}